

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

size_t __thiscall proto3_arena_unittest::NestedTestAllTypes::ByteSizeLong(NestedTestAllTypes *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *this_00;
  reference value;
  uint32_t *puVar4;
  size_t sVar5;
  NestedTestAllTypes *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  NestedTestAllTypes *this_;
  NestedTestAllTypes *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_repeated_child_size(this);
  sStack_58 = (size_t)iVar3;
  this_00 = _internal_repeated_child(this);
  __end2 = google::protobuf::RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes>::begin
                     (this_00);
  msg = (NestedTestAllTypes *)
        google::protobuf::RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes>::end(this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_proto3_arena_unittest::NestedTestAllTypes>::operator*(&__end2)
    ;
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3_arena_unittest::NestedTestAllTypes>(value);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto3_arena_unittest::NestedTestAllTypes>
    ::operator++(&__end2);
  }
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto3_arena_unittest::NestedTestAllTypes>((this->field_0)._impl_.child_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto3_arena_unittest::TestAllTypes>((this->field_0)._impl_.payload_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto3_arena_unittest::TestAllTypes>((this->field_0)._impl_.lazy_payload_)
      ;
      sStack_58 = sVar5 + 1 + sStack_58;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t NestedTestAllTypes::ByteSizeLong() const {
  const NestedTestAllTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_arena_unittest.NestedTestAllTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto3_arena_unittest.NestedTestAllTypes repeated_child = 3;
    {
      total_size += 1UL * this_._internal_repeated_child_size();
      for (const auto& msg : this_._internal_repeated_child()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // .proto3_arena_unittest.NestedTestAllTypes child = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
    // .proto3_arena_unittest.TestAllTypes payload = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.payload_);
    }
    // .proto3_arena_unittest.TestAllTypes lazy_payload = 4 [lazy = true];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.lazy_payload_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}